

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O0

void pd_defaultlist(t_pd *x,t_symbol *s,int argc,t_atom *argv)

{
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_pd *x_local;
  
  if ((argc == 0) && ((*x)->c_bangmethod != pd_defaultbang)) {
    (*(*x)->c_bangmethod)(x);
    return;
  }
  if (argc == 1) {
    if ((argv->a_type == A_FLOAT) && ((*x)->c_floatmethod != pd_defaultfloat)) {
      (*(*x)->c_floatmethod)(x,(argv->a_w).w_float);
      return;
    }
    if ((argv->a_type == A_SYMBOL) && ((*x)->c_symbolmethod != pd_defaultsymbol)) {
      (*(*x)->c_symbolmethod)(x,(argv->a_w).w_symbol);
      return;
    }
    if ((argv->a_type == A_POINTER) && ((*x)->c_pointermethod != pd_defaultpointer)) {
      (*(*x)->c_pointermethod)(x,(t_gpointer *)(argv->a_w).w_symbol);
      return;
    }
  }
  if ((*x)->c_anymethod == pd_defaultanything) {
    if ((*x)->c_patchable == '\0') {
      pd_defaultanything(x,&s_list,argc,argv);
    }
    else {
      obj_list((t_object *)x,s,argc,argv);
    }
  }
  else {
    (*(*x)->c_anymethod)(x,&s_list,argc,argv);
  }
  return;
}

Assistant:

static void pd_defaultlist(t_pd *x, t_symbol *s, int argc, t_atom *argv)
{
            /* a list with no elements is handled by the 'bang' method if
            one exists. */
    if (argc == 0 && *(*x)->c_bangmethod != pd_defaultbang)
    {
        (*(*x)->c_bangmethod)(x);
        return;
    }
            /* a list with one element which is a number can be handled by a
            "float" method if any is defined; same for "symbol", "pointer". */
    if (argc == 1)
    {
        if (argv->a_type == A_FLOAT &&
        *(*x)->c_floatmethod != pd_defaultfloat)
        {
            (*(*x)->c_floatmethod)(x, argv->a_w.w_float);
            return;
        }
        else if (argv->a_type == A_SYMBOL &&
            *(*x)->c_symbolmethod != pd_defaultsymbol)
        {
            (*(*x)->c_symbolmethod)(x, argv->a_w.w_symbol);
            return;
        }
        else if (argv->a_type == A_POINTER &&
            *(*x)->c_pointermethod != pd_defaultpointer)
        {
            (*(*x)->c_pointermethod)(x, argv->a_w.w_gpointer);
            return;
        }
    }
        /* Next try for an "anything" method */
    if ((*x)->c_anymethod != pd_defaultanything)
        (*(*x)->c_anymethod)(x, &s_list, argc, argv);

        /* if the object is patchable (i.e., can have proper inlets)
            send it on to obj_list which will unpack the list into the inlets */
    else if ((*x)->c_patchable)
        obj_list((t_object *)x, s, argc, argv);
            /* otherwise gove up and complain. */
    else pd_defaultanything(x, &s_list, argc, argv);
}